

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

string * draco::RemoveFileExtension(string *__return_storage_ptr__,string *filename)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  
  lVar3 = std::__cxx11::string::rfind((char)filename,0x2e);
  sVar1 = filename->_M_string_length;
  if (lVar3 == sVar1 - 1 || lVar3 + 1U < 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RemoveFileExtension(const std::string &filename) {
  const size_t pos = filename.find_last_of('.');
  if (pos == 0 || pos == std::string::npos || pos == filename.length() - 1) {
    return filename;
  }
  return filename.substr(0, pos);
}